

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vorbisfile.c
# Opt level: O0

int ov_fopen(char *path,OggVorbis_File *vf)

{
  FILE *__stream;
  FILE *f;
  int ret;
  OggVorbis_File *vf_local;
  char *path_local;
  
  __stream = fopen(path,"rb");
  if (__stream == (FILE *)0x0) {
    path_local._4_4_ = -1;
  }
  else {
    path_local._4_4_ = ov_open((FILE *)__stream,vf,(char *)0x0,0);
    if (path_local._4_4_ != 0) {
      fclose(__stream);
    }
  }
  return path_local._4_4_;
}

Assistant:

int ov_fopen(const char *path,OggVorbis_File *vf){
  int ret;
  FILE *f = fopen(path,"rb");
  if(!f) return -1;

  ret = ov_open(f,vf,NULL,0);
  if(ret) fclose(f);
  return ret;
}